

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DestroyContext::exec(DestroyContext *this,Thread *t)

{
  _func_int **pp_Var1;
  EGLDisplay pvVar2;
  deUint32 err;
  deBool dVar3;
  MessageBuilder *pMVar4;
  GLES2Context *pGVar5;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  DestroyContext *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [28])"Begin -- eglDestroyContext(");
  pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pGVar5->display);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
  pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pGVar5->context);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a94734);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    pp_Var1 = local_20[1].super_Thread._vptr_Thread;
    pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pvVar2 = pGVar5->display;
    pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    (**(code **)(*pp_Var1 + 0x98))(pp_Var1,pvVar2,pGVar5->context);
    err = (**(code **)(*local_20[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"destroyContext(m_context->display, m_context->context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x28f);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [27])"End -- eglDestroyContext()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
  pGVar5->display = (EGLDisplay)0x0;
  pGVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
  pGVar5->context = (EGLContext)0x0;
  return;
}

Assistant:

void DestroyContext::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroyContext(" << m_context->display << ", " << m_context->context << ")" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, destroyContext(m_context->display, m_context->context));
	thread.newMessage() << "End -- eglDestroyContext()" << tcu::ThreadUtil::Message::End;
	m_context->display	= EGL_NO_DISPLAY;
	m_context->context	= EGL_NO_CONTEXT;
}